

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute.cpp
# Opt level: O2

int match(State *initial,P_Sequence *p,bool allpaths)

{
  P_Sequence *pPVar1;
  int iVar2;
  reference ppPVar3;
  int iVar4;
  vector<StateP,_std::allocator<StateP>_> stk;
  State local_f0;
  StateP local_98;
  
  stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  State::State(&local_f0,initial);
  StateP::StateP(&local_98,&local_f0,p,0);
  std::vector<StateP,_std::allocator<StateP>_>::emplace_back<StateP>(&stk,&local_98);
  State::~State(&local_98.st);
  State::~State(&local_f0);
  iVar4 = 0;
  do {
    while( true ) {
      if (stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
          _M_finish) goto LAB_0010d570;
      pPVar1 = stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].seq;
      if ((long)(pPVar1->v).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pPVar1->v).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 !=
          (long)stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].iseq) break;
      stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1].iseq = pPVar1->iparent + 1;
      stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1].seq = pPVar1->parent;
    }
    ppPVar3 = std::vector<Pattern_*,_std::allocator<Pattern_*>_>::at
                        (&pPVar1->v,
                         (long)stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                               super__Vector_impl_data._M_finish[-1].iseq);
    iVar2 = Pattern_match(*ppPVar3,&stk);
    if (iVar2 == 1) {
      if (!allpaths) {
        iVar4 = 1;
        goto LAB_0010d570;
      }
      iVar4 = iVar4 + 1;
      stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
      _M_finish = stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      State::~State(&(stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                      super__Vector_impl_data._M_finish)->st);
    }
  } while ((ulong)(((long)stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x68) < 100000);
  iVar4 = -1;
LAB_0010d570:
  std::vector<StateP,_std::allocator<StateP>_>::~vector(&stk);
  return iVar4;
}

Assistant:

int match(State initial, P_Sequence *p, bool allpaths) {
    int nmatch = 0;
    vector<StateP> stk;
    stk.push_back(StateP{ initial, p, 0 });
    while (!stk.empty()) {
        auto &bk = stk.back();
        if (bk.iseq == bk.seq->v.size()) {
            bk.iseq = bk.seq->iparent + 1;
            bk.seq = bk.seq->parent;
        } else {
            if (Pattern_match(bk.seq->v.at(bk.iseq), stk) == 1) {
                if (!allpaths) return 1;
                nmatch++;
                stk.pop_back();
            }
            if (stk.size() > MAX_PATTERN_STACK) {
                return MATCH_RESULT_OVERFLOW;
            }
        }
    }
    return nmatch;
}